

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  string *psVar2;
  stringstream *this;
  uchar value;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  string local_58;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  this = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this);
  *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
  if (str->_M_string_length != 0) {
    poVar6 = (ostream *)(this + 0x10);
    uVar7 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar7];
      uVar4 = (uint)bVar1;
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          if (!is_attribute) {
            local_58._M_dataplus._M_p._0_1_ = 0x22;
            bVar1 = (byte)local_58._M_dataplus._M_p;
            goto LAB_00164fdf;
          }
          lVar3 = 6;
          pcVar5 = "&quot;";
          goto LAB_00164fea;
        }
        if (bVar1 == 0x26) {
          lVar3 = 5;
          pcVar5 = "&amp;";
          goto LAB_00164fea;
        }
LAB_00164f41:
        if (('\x1f' < (char)bVar1) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
          if ((!is_attribute) || ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
          goto LAB_00164fdf;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"&#x",3);
          String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)uVar4,value);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                             (byte)local_58._M_dataplus._M_p),
                     local_58._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
              &local_58.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p
                                    ),local_58.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        if (bVar1 == 0x27) {
          if (is_attribute) {
            lVar3 = 6;
            pcVar5 = "&apos;";
          }
          else {
            local_58._M_dataplus._M_p._0_1_ = 0x27;
            bVar1 = (byte)local_58._M_dataplus._M_p;
LAB_00164fdf:
            local_58._M_dataplus._M_p._0_1_ = bVar1;
            lVar3 = 1;
            pcVar5 = (char *)&local_58;
          }
        }
        else if (uVar4 == 0x3e) {
          lVar3 = 4;
          pcVar5 = "&gt;";
        }
        else {
          if (uVar4 != 0x3c) goto LAB_00164f41;
          lVar3 = 4;
          pcVar5 = "&lt;";
        }
LAB_00164fea:
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar3);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < str->_M_string_length);
  }
  psVar2 = local_38;
  StringStreamToString(local_38,(stringstream *)this);
  (**(code **)(*(long *)this + 8))(this);
  return psVar2;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}